

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_snapshots.cpp
# Opt level: O2

bool SaveSNA_ZX(path *fname,word start)

{
  byte *pbVar1;
  CDevice *pCVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FILE *__s;
  CDeviceSlot *pCVar9;
  CDevicePage *pCVar10;
  size_t sVar11;
  uchar uVar12;
  int *piVar13;
  byte bVar14;
  aint i;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  int address;
  FILE *ff;
  ulong local_90;
  byte snbuf [31];
  string local_60;
  int pages128 [3];
  
  if (DeviceID == (char *)0x0) {
    pcVar15 = "[SAVESNA] Only for real device emulation mode.";
  }
  else {
    bVar4 = IsZXSpectrumDevice(DeviceID);
    if (bVar4) {
      __s = (FILE *)SJ_fopen(fname,"wb");
      ff = (FILE *)__s;
      if (__s == (FILE *)0x0) {
        std::filesystem::__cxx11::path::string(&local_60,fname);
        Error("opening file for write",local_60._M_dataplus._M_p,PASS3);
        std::__cxx11::string::~string((string *)&local_60);
      }
      else {
        snbuf[0] = '?';
        snbuf[1] = 'X';
        snbuf[2] = '\'';
        snbuf[3] = 0x9b;
        snbuf[4] = '6';
        snbuf[5] = '\0';
        snbuf[6] = '\0';
        snbuf[7] = 'D';
        snbuf[8] = '\0';
        snbuf[9] = '+';
        snbuf[10] = '-';
        snbuf[0xb] = 0xdc;
        snbuf[0xc] = '\\';
        snbuf[0xf] = ':';
        snbuf[0x10] = '\\';
        snbuf[0x11] = '<';
        snbuf[0x12] = 0xff;
        snbuf[0x13] = '\0';
        snbuf[0x14] = '\0';
        snbuf[0x15] = 'T';
        snbuf[0x16] = '\0';
        snbuf[0x17] = '\0';
        snbuf[0x18] = '\0';
        snbuf[0x19] = '\x01';
        snbuf[0x1a] = '\a';
        snbuf[0x1b] = '\0';
        snbuf[0x1c] = '\0';
        snbuf[0x1d] = '\0';
        snbuf[0x1e] = '\0';
        snbuf._13_2_ = start;
        iVar6 = strcmp(DeviceID,"ZXSPECTRUM48");
        iVar8 = Device->ZxRamTop;
        local_90 = (ulong)(iVar8 - 3);
        bVar4 = true;
        for (uVar16 = (uint)(iVar6 != 0) * 2 - 2; pCVar2 = Device, uVar16 != 4; uVar16 = uVar16 + 1)
        {
          if ((int)uVar16 < 0) {
            uVar12 = '\0';
          }
          else {
            uVar12 = "\x03\x13"[uVar16];
          }
          address = (int)local_90 + uVar16;
          iVar7 = CDevice::GetSlotOfA16(Device,address);
          pCVar9 = CDevice::GetSlot(pCVar2,iVar7);
          pCVar10 = CDevice::GetPage(Device,(int)pCVar9->InitialPage);
          bVar4 = (bool)(bVar4 & uVar12 == pCVar10->RAM[(long)address & (long)pCVar10->Size - 1U]);
        }
        bVar5 = (byte)(start >> 8);
        bVar14 = (byte)start;
        if (bVar4) {
          if (iVar6 == 0) {
            iVar7 = CDevice::GetSlotOfA16(Device,iVar8 + -4);
            pCVar9 = CDevice::GetSlot(pCVar2,iVar7);
            pCVar10 = CDevice::GetPage(Device,(int)pCVar9->InitialPage);
            pCVar10->RAM[(long)(iVar8 + -4) & (long)pCVar10->Size - 1U] = bVar5;
            pCVar2 = Device;
            uVar16 = iVar8 - 5;
            iVar8 = CDevice::GetSlotOfA16(Device,uVar16);
            pCVar9 = CDevice::GetSlot(pCVar2,iVar8);
            pCVar10 = CDevice::GetPage(Device,(int)pCVar9->InitialPage);
            pCVar10->RAM[(long)(int)uVar16 & (long)pCVar10->Size - 1U] = bVar14;
            local_90 = (ulong)uVar16;
          }
          snbuf[0x17] = (char)(short)local_90;
          snbuf[0x18] = (char)((ushort)(short)local_90 >> 8);
        }
        else if (iVar6 == 0) {
          WarningById(W_SNA_48,(char *)0x0,W_PASS3);
          snbuf[0x17] = '\0';
          snbuf[0x18] = '@';
          pCVar10 = CDevice::GetPage(Device,1);
          *pCVar10->RAM = bVar14;
          pCVar10 = CDevice::GetPage(Device,1);
          pCVar10->RAM[1] = bVar5;
        }
        else {
          snbuf[0x17] = '\0';
          snbuf[0x18] = '`';
        }
        sVar11 = fwrite(snbuf,1,0x1b,__s);
        if (sVar11 == 0x1b) {
          pages128[0] = 5;
          pages128[1] = 2;
          pCVar9 = CDevice::GetSlot(Device,3);
          pages128[2] = pCVar9->Page->Number;
          piVar13 = &DAT_0015a570;
          if (iVar6 != 0) {
            piVar13 = pages128;
          }
          lVar17 = 0;
          do {
            uVar3 = snbuf._23_8_;
            if (lVar17 == 0xc) {
              if (iVar6 == 0) goto LAB_0011705d;
              snbuf[0x1b] = bVar14;
              snbuf._29_2_ = SUB82(uVar3,6);
              snbuf[0x1c] = bVar5;
              pCVar9 = CDevice::GetSlot(Device,3);
              snbuf[0x1d] = (char)pCVar9->Page->Number + '\x10';
              snbuf[0x1e] = '\0';
              sVar11 = fwrite(snbuf + 0x1b,1,4,__s);
              if (sVar11 == 4) {
                iVar8 = 0;
                goto LAB_00116fc2;
              }
              break;
            }
            iVar8 = *(int *)((long)piVar13 + lVar17);
            pCVar10 = CDevice::GetPage(Device,iVar8);
            pbVar1 = pCVar10->RAM;
            pCVar10 = CDevice::GetPage(Device,iVar8);
            sVar11 = fwrite(pbVar1,1,(long)pCVar10->Size,__s);
            pCVar10 = CDevice::GetPage(Device,iVar8);
            lVar17 = lVar17 + 4;
          } while (pCVar10->Size == (int)sVar11);
        }
LAB_00117042:
        writeError(fname,&ff);
      }
      return false;
    }
    pcVar15 = "[SAVESNA] Device must be ZXSPECTRUM48 or ZXSPECTRUM128.";
  }
  Error(pcVar15,(char *)0x0,PASS3);
  return false;
LAB_00116fc2:
  if (iVar8 == 8) {
LAB_0011705d:
    iVar8 = Device->PagesCount;
    pCVar10 = CDevice::GetPage(Device,0);
    pcVar15 = W_SNA_128;
    if (0x20000 < iVar8 * pCVar10->Size) {
      std::filesystem::__cxx11::path::string(&local_60,fname);
      WarningById(pcVar15,local_60._M_dataplus._M_p,W_PASS3);
      std::__cxx11::string::~string((string *)&local_60);
    }
    fclose(__s);
    return true;
  }
  pCVar9 = CDevice::GetSlot(Device,3);
  if (((iVar8 != pCVar9->Page->Number) && (iVar8 != 2)) && (iVar8 != 5)) {
    pCVar10 = CDevice::GetPage(Device,iVar8);
    pbVar1 = pCVar10->RAM;
    pCVar10 = CDevice::GetPage(Device,iVar8);
    sVar11 = fwrite(pbVar1,1,(long)pCVar10->Size,__s);
    pCVar10 = CDevice::GetPage(Device,iVar8);
    if (pCVar10->Size != (int)sVar11) goto LAB_00117042;
  }
  iVar8 = iVar8 + 1;
  goto LAB_00116fc2;
}

Assistant:

bool SaveSNA_ZX(const std::filesystem::path & fname, word start) {
	// for Lua
	if (!DeviceID) {
		Error("[SAVESNA] Only for real device emulation mode.");
		return false;
	} else if (!IsZXSpectrumDevice(DeviceID)) {
		Error("[SAVESNA] Device must be ZXSPECTRUM48 or ZXSPECTRUM128.");
		return false;
	}

	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str());
		return false;
	}

	constexpr int SNA_HEADER_48_SIZE = 27;
	constexpr int SNA_HEADER_128_SIZE = 4;
	byte snbuf[SNA_HEADER_48_SIZE + SNA_HEADER_128_SIZE] = {
	//	I     L'    H'    E'    D'    C'    B'    F'    A'    L     H     E     D     C **  B **
		0x3F, 0x58, 0x27, 0x9B, 0x36, 0x00, 0x00, 0x44, 0x00, 0x2B, 0x2D, 0xDC, 0x5C, 0x00, 0x00,
	//	IYL   IYH   IXL   IXH   IFF2  R     F     A     SP(L) SP(H) IM #  border
		0x3A, 0x5C, 0x3C, 0xFF, 0x00, 0x00, 0x54, 0x00, 0x00, 0x00, 0x01, 0x07,
	// end of 48k SNA header, following 4 bytes are extra 128k SNA header "interlude" after 48k data
	//	PC(L) PC(H) 7FFD  TR-DOS
		0x00, 0x00, 0x00, 0x00
	};

	// set BC to start address
	snbuf[13] = start & 0xFF;
	snbuf[14] = (start>>8) & 0xFF;

	// check if default ZX-like stack was modified - if not, it will be used for snapshot
	bool is48kSnap = !strcmp(DeviceID, "ZXSPECTRUM48");
	bool defaultStack = true;
	aint stackAdr = Device->ZxRamTop + 1 - sizeof(ZX_STACK_DATA);
	for (aint ii = is48kSnap ? -2 : 0; ii < aint(sizeof(ZX_STACK_DATA)); ++ii) {
		// will check for 48k snap if there is `00 00` ahead of fake stack data
		const byte cmpValue = (0 <= ii) ? ZX_STACK_DATA[ii] : 0;
		CDeviceSlot* slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr + ii));
		CDevicePage* page = Device->GetPage(slot->InitialPage);
		defaultStack &= (cmpValue == page->RAM[(stackAdr + ii) & (page->Size-1)]);
	}
	if (defaultStack) {
		if (is48kSnap) {
			--stackAdr;
			// inject PC under default stack
			CDeviceSlot* slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr));
			CDevicePage* page = Device->GetPage(slot->InitialPage);
			page->RAM[stackAdr & (page->Size-1)] = (start>>8) & 0xFF;
			--stackAdr;
			slot = Device->GetSlot(Device->GetSlotOfA16(stackAdr));
			page = Device->GetPage(slot->InitialPage);
			page->RAM[stackAdr & (page->Size-1)] = start & 0xFF;
		}
		// SP (may point to injected start address for 48k snap)
		snbuf[23] = (stackAdr) & 0xFF;
		snbuf[24] = (stackAdr>>8) & 0xFF;
	} else {
		if (is48kSnap) {
			WarningById(W_SNA_48);
			snbuf[23] = 0x00; //sp
			snbuf[24] = 0x40; //sp
			Device->GetPage(1)->RAM[0] = start & 0xFF;	//pc
			Device->GetPage(1)->RAM[1] = start >> 8;	//pc
		} else {
			snbuf[23] = 0x00; //sp
			snbuf[24] = 0x60; //sp
		}
	}

	if (fwrite(snbuf, 1, SNA_HEADER_48_SIZE, ff) != SNA_HEADER_48_SIZE) {
		return writeError(fname, ff);
	}

	const int pages48[3] = { 1, 2, 3 };
	const int pages128[3] = { 5, 2, Device->GetSlot(3)->Page->Number };

	for (const int page : is48kSnap ? pages48 : pages128) {
		if ((aint) fwrite(Device->GetPage(page)->RAM, 1, Device->GetPage(page)->Size, ff) != Device->GetPage(page)->Size) {
			return writeError(fname, ff);
		}
	}

	if (!is48kSnap) {
		// 128k snapshot extra header fields
		snbuf[27] = start & 0xFF; //pc
		snbuf[28] = (start>>8) & 0xFF; //pc
		snbuf[29] = 0x10 + Device->GetSlot(3)->Page->Number; //7ffd
		snbuf[30] = 0; //tr-dos
		if (fwrite(snbuf + SNA_HEADER_48_SIZE, 1, SNA_HEADER_128_SIZE, ff) != SNA_HEADER_128_SIZE) {
			return writeError(fname, ff);
		}
		// 128k banks
		for (aint i = 0; i < 8; i++) {
			if (i != Device->GetSlot(3)->Page->Number && i != 2 && i != 5) {
				if ((aint) fwrite(Device->GetPage(i)->RAM, 1, Device->GetPage(i)->Size, ff) != Device->GetPage(i)->Size) {
					return writeError(fname, ff);
				}
			}
		}
	}

	if (128*1024 < Device->PagesCount * Device->GetPage(0)->Size) {
		WarningById(W_SNA_128, fname.string().c_str());
	}

	fclose(ff);
	return true;
}